

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausRecordClause2(Clu_Man_t *p,Aig_Cut_t *pCut,int iMint,int Cost)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < pCut->nFanins; lVar1 = lVar1 + 1) {
    Vec_IntPush(p->vLits,(uint)(((uint)iMint >> ((uint)lVar1 & 0x1f) & 1) != 0) +
                         p->pCnf->pVarNums[*(int *)((long)&pCut[1].pNext + lVar1 * 4)] * 2);
  }
  Vec_IntPush(p->vClauses,p->vLits->nSize);
  Vec_IntPush(p->vCosts,Cost);
  return;
}

Assistant:

void Fra_ClausRecordClause2( Clu_Man_t * p, Aig_Cut_t * pCut, int iMint, int Cost )
{
    int i;
    for ( i = 0; i < (int)pCut->nFanins; i++ )
        Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pCut->pFanins[i]], (iMint&(1<<i)) ) );
    Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
    Vec_IntPush( p->vCosts, Cost );
}